

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O0

void receive_sysex(void)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  PmError count;
  int i;
  PmEvent msg;
  int bytes_on_line;
  int data;
  int shift;
  PortMidiStream *midi;
  FILE *f;
  char line [80];
  
  msg.timestamp = 0;
  msg.message = 0;
  iVar1 = get_number("Type input device number: ");
  Pm_OpenInput((PortMidiStream **)&data,iVar1,(void *)0x0,0x200,(PmTimeProcPtr)0x0,(void *)0x0);
  printf("Midi Input opened, type file for sysex data: ");
  fgets((char *)&f,0x50,_stdin);
  sVar3 = strlen((char *)&f);
  if (sVar3 != 0) {
    sVar3 = strlen((char *)&f);
    *(undefined1 *)((long)&midi + sVar3 + 7) = 0;
  }
  midi = fopen((char *)&f,"w");
  if ((FILE *)midi == (FILE *)0x0) {
    printf("Could not open %s\n",&f);
    Pm_Close(_data);
  }
  else {
    printf("Ready to receive a sysex message\n");
    while (msg.timestamp != 0xf7) {
      iVar1 = Pm_Read(_data,(PmEvent *)&count,1);
      if ((iVar1 != 0) && ((count & 0xf0) != 0xf8)) {
        bytes_on_line = 0;
        while ((bytes_on_line < 0x20 && msg.timestamp != 0xf7 &&
               ((uVar2 = count >> ((byte)bytes_on_line & 0x1f), msg.timestamp = uVar2 & 0xff,
                (uVar2 & 0x80) == 0 || (msg.timestamp == 0xf7))))) {
          fprintf((FILE *)midi,"%2x ",(ulong)(uint)msg.timestamp);
          msg.message = msg.message + 1;
          if (0xf < msg.message) {
            fprintf((FILE *)midi,"\n");
            msg.message = 0;
          }
          bytes_on_line = bytes_on_line + 8;
        }
      }
    }
    fclose((FILE *)midi);
    Pm_Close(_data);
  }
  return;
}

Assistant:

void receive_sysex()
{
    char line[80];
    FILE *f;
    PmStream *midi;
    int shift = 0;
    int data = 0;
    int bytes_on_line = 0;
    PmEvent msg;

    /* determine which output device to use */
    int i = get_number("Type input device number: ");

    /* open input device */
    Pm_OpenInput(&midi, i, NULL, 512, NULL, NULL);
    printf("Midi Input opened, type file for sysex data: ");

    /* open file */
    fgets(line, STRING_MAX, stdin);
    /* remove the newline character */
    if (strlen(line) > 0) line[strlen(line) - 1] = 0;
    f = fopen(line, "w");
    if (!f) {
        printf("Could not open %s\n", line);
        Pm_Close(midi);
        return;
    }

    printf("Ready to receive a sysex message\n");

    /* read data and write to file */
    while (data != MIDI_EOX) {
        PmError count;
        count = Pm_Read(midi, &msg, 1);
        /* CAUTION: this causes busy waiting. It would be better to 
           be in a polling loop to avoid being compute bound. PortMidi
           does not support a blocking read since this is so seldom
           useful.
         */
        if (count == 0) continue;
        /* ignore real-time messages */
        if (is_real_time_msg(Pm_MessageStatus(msg.message))) continue;

        /* write 4 bytes of data until you reach an eox */
        for (shift = 0; shift < 32 && (data != MIDI_EOX); shift += 8) {
            data = (msg.message >> shift) & 0xFF;
            /* if this is a status byte that's not MIDI_EOX, the sysex
               message is incomplete and there is no more sysex data */
            if (data & 0x80 && data != MIDI_EOX) break;
            fprintf(f, "%2x ", data);
            if (++bytes_on_line >= 16) {
                fprintf(f, "\n");
                bytes_on_line = 0;
            }
        }
    }
    fclose(f);
    Pm_Close(midi);
}